

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# junit_log_formatter.hpp
# Opt level: O1

void __thiscall
boost::unit_test::output::junit_log_formatter::~junit_log_formatter(junit_log_formatter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _List_node_base *p_Var2;
  pointer pcVar3;
  _List_node_base *p_Var4;
  
  (this->super_unit_test_log_formatter)._vptr_unit_test_log_formatter =
       (_func_int **)&PTR__junit_log_formatter_001caa38;
  p_Var4 = (this->list_path_to_root).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var4 != (_List_node_base *)&this->list_path_to_root) {
    p_Var2 = p_Var4->_M_next;
    operator_delete(p_Var4,0x18);
    p_Var4 = p_Var2;
  }
  std::
  vector<boost::unit_test::output::junit_impl::junit_log_helper::assertion_entry,_std::allocator<boost::unit_test::output::junit_impl::junit_log_helper::assertion_entry>_>
  ::~vector(&(this->runner_log_entry).assertion_entries);
  pcVar3 = (this->runner_log_entry).skipping_reason._M_dataplus._M_p;
  paVar1 = &(this->runner_log_entry).skipping_reason.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&(this->runner_log_entry).system_err.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&this->runner_log_entry);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_boost::unit_test::output::junit_impl::junit_log_helper>,_std::_Select1st<std::pair<const_unsigned_long,_boost::unit_test::output::junit_impl::junit_log_helper>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_boost::unit_test::output::junit_impl::junit_log_helper>_>_>
  ::~_Rb_tree(&(this->map_tests)._M_t);
  operator_delete(this,0xd0);
  return;
}

Assistant:

junit_log_formatter() : m_display_build_info(false)
    {
        // we log everything from the logger singleton point of view
        // because we need to know about all the messages/commands going to the logger
        // we decide what we put inside the logs internally
        this->m_log_level = log_successful_tests;
        m_log_level_internal = log_messages;
    }